

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus DecodeI64RegsRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  uint Reg;
  void *Decoder_local;
  uint64_t Address_local;
  uint RegNo_local;
  MCInst *Inst_local;
  
  if (RegNo < 0x20) {
    MCOperand_CreateReg0(Inst,IntRegDecoderTable[RegNo]);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeI64RegsRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = IntRegDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}